

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O2

void __thiscall
VW::config::options_serializer_boost_po::serialize<char>
          (options_serializer_boost_po *this,typed_option<char> *typed_option)

{
  char *pcVar1;
  ostream *poVar2;
  char cVar3;
  
  poVar2 = std::operator<<((ostream *)&this->field_0x18," --");
  poVar2 = std::operator<<(poVar2,(string *)&(typed_option->super_base_option).m_name);
  poVar2 = std::operator<<(poVar2," ");
  pcVar1 = (typed_option->m_value).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pcVar1 == (char *)0x0) {
    cVar3 = '\0';
  }
  else {
    cVar3 = *pcVar1;
  }
  std::operator<<(poVar2,cVar3);
  return;
}

Assistant:

void serialize(typed_option<T> typed_option)
  {
    m_output_stream << " --" << typed_option.m_name << " " << typed_option.value();
  }